

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::SQCompiler
          (SQCompiler *this,SQVM *v,SQLEXREADFUNC rg,SQUserPointer up,SQChar *sourcename,
          bool raiseerror,bool lineinfo)

{
  SQString *x;
  bool lineinfo_local;
  bool raiseerror_local;
  SQChar *sourcename_local;
  SQUserPointer up_local;
  SQLEXREADFUNC rg_local;
  SQVM *v_local;
  SQCompiler *this_local;
  
  ::SQObjectPtr::SQObjectPtr(&this->_sourcename);
  SQLexer::SQLexer(&this->_lex);
  this->_vm = v;
  SQLexer::Init(&this->_lex,v->_sharedstate,rg,up,ThrowError,this);
  x = SQString::Create(v->_sharedstate,sourcename,-1);
  ::SQObjectPtr::operator=(&this->_sourcename,x);
  this->_lineinfo = lineinfo;
  this->_raiseerror = raiseerror;
  (this->_scope).outers = 0;
  (this->_scope).stacksize = 0;
  this->_compilererror[0] = '\0';
  return;
}

Assistant:

SQCompiler(SQVM *v, SQLEXREADFUNC rg, SQUserPointer up, const SQChar* sourcename, bool raiseerror, bool lineinfo)
    {
        _vm=v;
        _lex.Init(_ss(v), rg, up,ThrowError,this);
        _sourcename = SQString::Create(_ss(v), sourcename);
        _lineinfo = lineinfo;_raiseerror = raiseerror;
        _scope.outers = 0;
        _scope.stacksize = 0;
        _compilererror[0] = _SC('\0');
    }